

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Count.cc
# Opt level: O3

ssize_t __thiscall Pl_Count::write(Pl_Count *this,int __fd,void *__buf,size_t __n)

{
  Members *pMVar1;
  Pipeline *pPVar2;
  int iVar3;
  ssize_t in_RAX;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  
  if (__buf != (void *)0x0) {
    if ((long)__buf < 0) {
      QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error((unsigned_long)__buf);
    }
    pMVar1 = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_Count::Members,_std::default_delete<Pl_Count::Members>_>._M_t.
             super__Tuple_impl<0UL,_Pl_Count::Members_*,_std::default_delete<Pl_Count::Members>_>.
             super__Head_base<0UL,_Pl_Count::Members_*,_false>._M_head_impl;
    pMVar1->count = pMVar1->count + (long)__buf;
    pMVar1->last_char = *(uchar *)(CONCAT44(in_register_00000034,__fd) + -1 + (long)__buf);
    pPVar2 = (this->super_Pipeline).next_;
    iVar3 = (*pPVar2->_vptr_Pipeline[2])(pPVar2,CONCAT44(in_register_00000034,__fd),__buf);
    return CONCAT44(extraout_var,iVar3);
  }
  return in_RAX;
}

Assistant:

void
Pl_Count::write(unsigned char const* buf, size_t len)
{
    if (len) {
        m->count += QIntC::to_offset(len);
        m->last_char = buf[len - 1];
        next()->write(buf, len);
    }
}